

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bluetooth_packet.c
# Opt level: O0

void add_syndrome(uint64_t syndrome,uint64_t error)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  UT_hash_handle *pUVar4;
  uint64_t uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  syndrome_struct *psVar9;
  UT_hash_table *pUVar10;
  UT_hash_bucket *pUVar11;
  UT_hash_bucket *pUVar12;
  uint local_6c;
  UT_hash_bucket *_he_newbkt;
  UT_hash_bucket *_he_new_buckets;
  UT_hash_handle *_he_hh_nxt;
  UT_hash_handle *_he_thh;
  uint _he_bkt_i;
  uint _he_bkt;
  uchar *_hj_key;
  uint _hj_k;
  uint _hj_j;
  uint _hj_i;
  uint _ha_bkt;
  syndrome_struct *s;
  uint64_t error_local;
  uint64_t syndrome_local;
  
  psVar9 = (syndrome_struct *)malloc(0x48);
  psVar9->syndrome = syndrome;
  psVar9->error = error;
  (psVar9->hh).next = (void *)0x0;
  (psVar9->hh).key = psVar9;
  (psVar9->hh).keylen = 8;
  if (syndrome_map == (syndrome_struct *)0x0) {
    syndrome_map = psVar9;
    (psVar9->hh).prev = (void *)0x0;
    pUVar10 = (UT_hash_table *)malloc(0x40);
    (syndrome_map->hh).tbl = pUVar10;
    if ((syndrome_map->hh).tbl == (UT_hash_table *)0x0) {
      exit(-1);
    }
    memset((syndrome_map->hh).tbl,0,0x40);
    ((syndrome_map->hh).tbl)->tail = &syndrome_map->hh;
    ((syndrome_map->hh).tbl)->num_buckets = 0x20;
    ((syndrome_map->hh).tbl)->log2_num_buckets = 5;
    ((syndrome_map->hh).tbl)->hho = 0x10;
    pUVar11 = (UT_hash_bucket *)malloc(0x200);
    ((syndrome_map->hh).tbl)->buckets = pUVar11;
    if (((syndrome_map->hh).tbl)->buckets == (UT_hash_bucket *)0x0) {
      exit(-1);
    }
    memset(((syndrome_map->hh).tbl)->buckets,0,0x200);
    ((syndrome_map->hh).tbl)->signature = 0xa0111fe1;
  }
  else {
    ((syndrome_map->hh).tbl)->tail->next = psVar9;
    (psVar9->hh).prev =
         (void *)((long)((syndrome_map->hh).tbl)->tail - ((syndrome_map->hh).tbl)->hho);
    ((syndrome_map->hh).tbl)->tail = &psVar9->hh;
  }
  pUVar10 = (syndrome_map->hh).tbl;
  pUVar10->num_items = pUVar10->num_items + 1;
  (psVar9->hh).tbl = (syndrome_map->hh).tbl;
  (psVar9->hh).hashv = 0xfeedbeef;
  _hj_key._4_4_ = 0x9e3779b9;
  _hj_k = 0x9e3779b9;
  __he_bkt_i = psVar9;
  for (_hj_key._0_4_ = 8; 0xb < (uint)_hj_key; _hj_key._0_4_ = (uint)_hj_key - 0xc) {
    uVar5 = __he_bkt_i->syndrome;
    bVar1 = *(byte *)((long)&__he_bkt_i->syndrome + 1);
    bVar2 = *(byte *)((long)&__he_bkt_i->syndrome + 2);
    bVar3 = *(byte *)((long)&__he_bkt_i->syndrome + 3);
    iVar6 = (uint)*(byte *)((long)&__he_bkt_i->syndrome + 4) +
            (uint)*(byte *)((long)&__he_bkt_i->syndrome + 5) * 0x100 +
            (uint)*(byte *)((long)&__he_bkt_i->syndrome + 6) * 0x10000 +
            (uint)*(byte *)((long)&__he_bkt_i->syndrome + 7) * 0x1000000 + _hj_key._4_4_;
    (psVar9->hh).hashv =
         (uint)(byte)__he_bkt_i->error + (uint)*(byte *)((long)&__he_bkt_i->error + 1) * 0x100 +
         (uint)*(byte *)((long)&__he_bkt_i->error + 2) * 0x10000 +
         (uint)*(byte *)((long)&__he_bkt_i->error + 3) * 0x1000000 + (psVar9->hh).hashv;
    uVar7 = (psVar9->hh).hashv >> 0xd ^
            (((uint)(byte)uVar5 + (uint)bVar1 * 0x100 + (uint)bVar2 * 0x10000 +
              (uint)bVar3 * 0x1000000 + _hj_k) - iVar6) - (psVar9->hh).hashv;
    uVar8 = uVar7 << 8 ^ (iVar6 - (psVar9->hh).hashv) - uVar7;
    (psVar9->hh).hashv = (psVar9->hh).hashv - uVar7;
    (psVar9->hh).hashv = (psVar9->hh).hashv - uVar8;
    (psVar9->hh).hashv = uVar8 >> 0xd ^ (psVar9->hh).hashv;
    uVar7 = (psVar9->hh).hashv >> 0xc ^ (uVar7 - uVar8) - (psVar9->hh).hashv;
    uVar8 = uVar7 << 0x10 ^ (uVar8 - (psVar9->hh).hashv) - uVar7;
    (psVar9->hh).hashv = (psVar9->hh).hashv - uVar7;
    (psVar9->hh).hashv = (psVar9->hh).hashv - uVar8;
    (psVar9->hh).hashv = uVar8 >> 5 ^ (psVar9->hh).hashv;
    _hj_k = (psVar9->hh).hashv >> 3 ^ (uVar7 - uVar8) - (psVar9->hh).hashv;
    _hj_key._4_4_ = _hj_k << 10 ^ (uVar8 - (psVar9->hh).hashv) - _hj_k;
    (psVar9->hh).hashv = (psVar9->hh).hashv - _hj_k;
    (psVar9->hh).hashv = (psVar9->hh).hashv - _hj_key._4_4_;
    (psVar9->hh).hashv = _hj_key._4_4_ >> 0xf ^ (psVar9->hh).hashv;
    __he_bkt_i = (syndrome_struct *)((long)&__he_bkt_i->error + 4);
  }
  (psVar9->hh).hashv = (psVar9->hh).hashv + 8;
  switch((uint)_hj_key) {
  case 8:
    _hj_key._4_4_ =
         (uint)*(byte *)((long)&__he_bkt_i->syndrome + 4) +
         (uint)*(byte *)((long)&__he_bkt_i->syndrome + 5) * 0x100 +
         (uint)*(byte *)((long)&__he_bkt_i->syndrome + 6) * 0x10000 +
         (uint)*(byte *)((long)&__he_bkt_i->syndrome + 7) * 0x1000000 + _hj_key._4_4_;
  case 4:
    _hj_k = (uint)(byte)__he_bkt_i->syndrome +
            (uint)*(byte *)((long)&__he_bkt_i->syndrome + 1) * 0x100 +
            (uint)*(byte *)((long)&__he_bkt_i->syndrome + 2) * 0x10000 +
            (uint)*(byte *)((long)&__he_bkt_i->syndrome + 3) * 0x1000000 + _hj_k;
  }
  uVar7 = (psVar9->hh).hashv >> 0xd ^ (_hj_k - _hj_key._4_4_) - (psVar9->hh).hashv;
  uVar8 = uVar7 << 8 ^ (_hj_key._4_4_ - (psVar9->hh).hashv) - uVar7;
  (psVar9->hh).hashv = (psVar9->hh).hashv - uVar7;
  (psVar9->hh).hashv = (psVar9->hh).hashv - uVar8;
  (psVar9->hh).hashv = uVar8 >> 0xd ^ (psVar9->hh).hashv;
  uVar7 = (psVar9->hh).hashv >> 0xc ^ (uVar7 - uVar8) - (psVar9->hh).hashv;
  uVar8 = uVar7 << 0x10 ^ (uVar8 - (psVar9->hh).hashv) - uVar7;
  (psVar9->hh).hashv = (psVar9->hh).hashv - uVar7;
  (psVar9->hh).hashv = (psVar9->hh).hashv - uVar8;
  (psVar9->hh).hashv = uVar8 >> 5 ^ (psVar9->hh).hashv;
  uVar7 = (psVar9->hh).hashv >> 3 ^ (uVar7 - uVar8) - (psVar9->hh).hashv;
  uVar8 = uVar7 << 10 ^ (uVar8 - (psVar9->hh).hashv) - uVar7;
  (psVar9->hh).hashv = (psVar9->hh).hashv - uVar7;
  (psVar9->hh).hashv = (psVar9->hh).hashv - uVar8;
  (psVar9->hh).hashv = uVar8 >> 0xf ^ (psVar9->hh).hashv;
  uVar7 = (psVar9->hh).hashv & ((syndrome_map->hh).tbl)->num_buckets - 1;
  pUVar11 = ((syndrome_map->hh).tbl)->buckets;
  pUVar11[uVar7].count = pUVar11[uVar7].count + 1;
  (psVar9->hh).hh_next = ((syndrome_map->hh).tbl)->buckets[uVar7].hh_head;
  (psVar9->hh).hh_prev = (UT_hash_handle *)0x0;
  if (((syndrome_map->hh).tbl)->buckets[uVar7].hh_head != (UT_hash_handle *)0x0) {
    (((syndrome_map->hh).tbl)->buckets[uVar7].hh_head)->hh_prev = &psVar9->hh;
  }
  ((syndrome_map->hh).tbl)->buckets[uVar7].hh_head = &psVar9->hh;
  if (((((syndrome_map->hh).tbl)->buckets[uVar7].expand_mult + 1) * 10 <=
       ((syndrome_map->hh).tbl)->buckets[uVar7].count) && (((psVar9->hh).tbl)->noexpand != 1)) {
    pUVar11 = (UT_hash_bucket *)malloc((ulong)(((psVar9->hh).tbl)->num_buckets << 1) << 4);
    if (pUVar11 == (UT_hash_bucket *)0x0) {
      exit(-1);
    }
    memset(pUVar11,0,(ulong)(((psVar9->hh).tbl)->num_buckets << 1) << 4);
    ((psVar9->hh).tbl)->ideal_chain_maxlen =
         (((psVar9->hh).tbl)->num_items >> ((char)((psVar9->hh).tbl)->log2_num_buckets + 1U & 0x1f))
         + (uint)((((psVar9->hh).tbl)->num_items & ((psVar9->hh).tbl)->num_buckets * 2 - 1) != 0);
    ((psVar9->hh).tbl)->nonideal_items = 0;
    for (_he_thh._0_4_ = 0; (uint)_he_thh < ((psVar9->hh).tbl)->num_buckets;
        _he_thh._0_4_ = (uint)_he_thh + 1) {
      _he_hh_nxt = ((psVar9->hh).tbl)->buckets[(uint)_he_thh].hh_head;
      while (_he_hh_nxt != (UT_hash_handle *)0x0) {
        pUVar4 = _he_hh_nxt->hh_next;
        pUVar12 = pUVar11 + (_he_hh_nxt->hashv & ((psVar9->hh).tbl)->num_buckets * 2 - 1);
        uVar7 = pUVar12->count + 1;
        pUVar12->count = uVar7;
        if (((psVar9->hh).tbl)->ideal_chain_maxlen < uVar7) {
          pUVar10 = (psVar9->hh).tbl;
          pUVar10->nonideal_items = pUVar10->nonideal_items + 1;
          pUVar12->expand_mult = pUVar12->count / ((psVar9->hh).tbl)->ideal_chain_maxlen;
        }
        _he_hh_nxt->hh_prev = (UT_hash_handle *)0x0;
        _he_hh_nxt->hh_next = pUVar12->hh_head;
        if (pUVar12->hh_head != (UT_hash_handle *)0x0) {
          pUVar12->hh_head->hh_prev = _he_hh_nxt;
        }
        pUVar12->hh_head = _he_hh_nxt;
        _he_hh_nxt = pUVar4;
      }
    }
    free(((psVar9->hh).tbl)->buckets);
    pUVar10 = (psVar9->hh).tbl;
    pUVar10->num_buckets = pUVar10->num_buckets << 1;
    pUVar10 = (psVar9->hh).tbl;
    pUVar10->log2_num_buckets = pUVar10->log2_num_buckets + 1;
    ((psVar9->hh).tbl)->buckets = pUVar11;
    if (((psVar9->hh).tbl)->num_items >> 1 < ((psVar9->hh).tbl)->nonideal_items) {
      local_6c = ((psVar9->hh).tbl)->ineff_expands + 1;
    }
    else {
      local_6c = 0;
    }
    ((psVar9->hh).tbl)->ineff_expands = local_6c;
    if (1 < ((psVar9->hh).tbl)->ineff_expands) {
      ((psVar9->hh).tbl)->noexpand = 1;
    }
  }
  return;
}

Assistant:

static void add_syndrome(uint64_t syndrome, uint64_t error)
{
	syndrome_struct *s;
	s = malloc(sizeof(syndrome_struct));
	s->syndrome = syndrome;
	s->error = error;
	
    HASH_ADD(hh, syndrome_map, syndrome, 8, s);
}